

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Type * __thiscall
soul::heart::IODeclaration::getSampleArrayType
          (Type *__return_storage_ptr__,IODeclaration *this,Type *t)

{
  if ((this->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    Type::createArray(__return_storage_ptr__,t,
                      (ulong)(this->arraySize).super__Optional_base<unsigned_int,_true,_true>.
                             _M_payload.super__Optional_payload_base<unsigned_int>._M_payload.
                             _M_value);
  }
  else {
    Type::Type(__return_storage_ptr__,t);
  }
  return __return_storage_ptr__;
}

Assistant:

Type getSampleArrayType (Type t) const
        {
            return arraySize.has_value() ? t.createArray (*arraySize) : t;
        }